

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O0

void __thiscall
amrex::MLEBTensorOp::define
          (MLEBTensorOp *this,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *a_grids,
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *a_dmap,
          LPInfo *a_info,
          Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
          *a_factory)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  Long LVar4;
  reference pvVar5;
  DistributionMapping *pDVar6;
  type i;
  BoxArray *pBVar7;
  int j;
  int i_00;
  MLLinOp *in_RDI;
  int idim;
  int mglev;
  int amrlev;
  BoxArray *in_stack_fffffffffffffc68;
  MLLinOp *in_stack_fffffffffffffc70;
  DistributionMapping *in_stack_fffffffffffffc80;
  BoxArray *in_stack_fffffffffffffc88;
  BoxArray *in_stack_fffffffffffffc90;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  int local_288 [2];
  int local_280;
  int local_278 [2];
  int local_270;
  int local_268;
  int iStack_264;
  int local_260;
  IntVect local_25c;
  int local_250 [2];
  int local_248;
  int local_240 [2];
  int local_238;
  int local_22c [2];
  int local_224;
  undefined1 local_220 [120];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  int local_180 [2];
  int local_178;
  int local_170 [2];
  int local_168;
  undefined1 local_160 [72];
  Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  *in_stack_fffffffffffffee8;
  LPInfo *in_stack_fffffffffffffef0;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  *in_stack_fffffffffffffef8;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int iVar8;
  int iVar9;
  IntVect local_a4;
  int local_98 [2];
  int local_90;
  int local_88;
  IntVect local_84;
  int local_78 [2];
  int local_70;
  int local_68;
  IntVect local_64;
  int local_58 [2];
  int local_50;
  int *local_48;
  IntVect *local_40;
  IntVect local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  MLEBABecLap::define((MLEBABecLap *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                      in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                      in_stack_fffffffffffffee8);
  std::
  vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::clear((vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
           *)0x157f898);
  MLLinOp::NAMRLevels(in_RDI);
  std::
  vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::resize((vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
            *)in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
  MLLinOp::NAMRLevels(in_RDI);
  std::
  vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
  ::resize((vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
            *)in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
  MLLinOp::NAMRLevels(in_RDI);
  std::
  vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::resize((vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
            *)in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
  iVar8 = 0;
  while (iVar9 = iVar8, iVar2 = MLLinOp::NAMRLevels(in_RDI), iVar8 < iVar2) {
    Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                  *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
    MLLinOp::NMGLevels(in_stack_fffffffffffffc70,(int)((ulong)in_stack_fffffffffffffc68 >> 0x20));
    std::min<int>(&(anonymous_namespace)::kappa_num_mglevs,(int *)&stack0xffffffffffffff10);
    std::
    vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
    resize((vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
            *)in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
    Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
    Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                  *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
    Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
    size((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
          *)0x157f9fb);
    std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::resize
              ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
               in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
    Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                  *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
    Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                  *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
    Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
    size((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
          *)0x157fa50);
    std::
    vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
    resize((vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
            *)in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
    iVar8 = 0;
    while( true ) {
      lVar3 = (long)iVar8;
      Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                    *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
      LVar4 = Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              ::size((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      *)0x157fa9c);
      if (LVar4 <= lVar3) break;
      for (iVar2 = 0; iVar2 < 3; iVar2 = iVar2 + 1) {
        Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                      *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
        Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
        pvVar5 = std::array<amrex::MultiFab,_3UL>::operator[]
                           ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffc70,
                            (size_type)in_stack_fffffffffffffc68);
        Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                      *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
        Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                  ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                   in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
        local_68 = iVar2;
        if (iVar2 == 0) {
          IntVect::IntVect(&local_64,1,0,0);
        }
        else if (iVar2 == 1) {
          IntVect::IntVect(&local_64,0,1,0);
        }
        else {
          IntVect::IntVect(&local_64,0,0,1);
        }
        local_70 = local_64.vect[2];
        local_78[0] = local_64.vect[0];
        local_78[1] = local_64.vect[1];
        local_178 = local_64.vect[2];
        local_180[0] = local_64.vect[0];
        local_180[1] = local_64.vect[1];
        local_168 = local_64.vect[2];
        local_170[0] = local_64.vect[0];
        local_170[1] = local_64.vect[1];
        convert(in_stack_fffffffffffffc88,(IntVect *)in_stack_fffffffffffffc80);
        Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
        pDVar6 = Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
                 operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                             *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
        local_198 = 0;
        uStack_190 = 0;
        local_1a8 = 0;
        uStack_1a0 = 0;
        local_188 = 0;
        MFInfo::MFInfo((MFInfo *)0x157fc73);
        Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                      *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
        Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                      *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
        i = std::
            unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         *)in_stack_fffffffffffffc70);
        (*(pvVar5->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
                  (pvVar5,local_160,pDVar6,1,0,&local_1a8);
        MFInfo::~MFInfo((MFInfo *)0x157fcf3);
        BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffc70);
        Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                      *)in_stack_fffffffffffffc70,(size_type)i);
        Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      *)in_stack_fffffffffffffc70,(size_type)i);
        pvVar5 = std::array<amrex::MultiFab,_3UL>::operator[]
                           ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffc70,(size_type)i);
        Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                      *)in_stack_fffffffffffffc70,(size_type)i);
        Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                  ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                   in_stack_fffffffffffffc70,(size_type)i);
        local_88 = iVar2;
        if (iVar2 == 0) {
          IntVect::IntVect(&local_84,1,0,0);
        }
        else if (iVar2 == 1) {
          IntVect::IntVect(&local_84,0,1,0);
        }
        else {
          IntVect::IntVect(&local_84,0,0,1);
        }
        local_90 = local_84.vect[2];
        local_98[0] = local_84.vect[0];
        local_98[1] = local_84.vect[1];
        local_238 = local_84.vect[2];
        local_240[0] = local_84.vect[0];
        local_240[1] = local_84.vect[1];
        local_22c[0] = local_84.vect[0];
        local_22c[1] = local_84.vect[1];
        local_224 = local_84.vect[2];
        convert(in_stack_fffffffffffffc88,(IntVect *)in_stack_fffffffffffffc80);
        Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      *)in_stack_fffffffffffffc70,(size_type)i);
        pDVar6 = Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
                 operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                             *)in_stack_fffffffffffffc70,(size_type)i);
        IntVect::IntVect(&local_25c,1);
        if (iVar2 == 0) {
          IntVect::IntVect(&local_a4,1,0,0);
        }
        else if (iVar2 == 1) {
          IntVect::IntVect(&local_a4,0,1,0);
        }
        else {
          IntVect::IntVect(&local_a4,0,0,1);
        }
        local_270 = local_a4.vect[2];
        local_278[0] = local_a4.vect[0];
        local_278[1] = local_a4.vect[1];
        local_260 = local_a4.vect[2];
        local_268 = local_a4.vect[0];
        iStack_264 = local_a4.vect[1];
        uVar1 = _local_268;
        local_40 = &local_25c;
        local_48 = &local_268;
        local_c = 0;
        local_268 = local_a4.vect[0];
        i_00 = local_25c.vect[0] - local_268;
        local_1c = 1;
        iStack_264 = local_a4.vect[1];
        j = local_25c.vect[1] - iStack_264;
        local_2c = 2;
        _local_268 = uVar1;
        local_28 = local_48;
        local_18 = local_48;
        local_8 = local_48;
        IntVect::IntVect(&local_38,i_00,j,local_25c.vect[2] - local_a4.vect[2]);
        local_50 = local_38.vect[2];
        local_58[0] = local_38.vect[0];
        local_58[1] = local_38.vect[1];
        local_280 = local_38.vect[2];
        local_288[0] = local_38.vect[0];
        local_288[1] = local_38.vect[1];
        local_248 = local_38.vect[2];
        local_250[0] = local_38.vect[0];
        local_250[1] = local_38.vect[1];
        local_2a8 = 0;
        uStack_2a0 = 0;
        local_2b8 = 0;
        uStack_2b0 = 0;
        local_298 = 0;
        MFInfo::MFInfo((MFInfo *)0x15800aa);
        Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                      *)in_stack_fffffffffffffc70,(size_type)i);
        Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                      *)in_stack_fffffffffffffc70,(size_type)i);
        in_stack_fffffffffffffc68 =
             (BoxArray *)
             std::
             unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          *)in_stack_fffffffffffffc70);
        in_stack_fffffffffffffc90 = in_stack_fffffffffffffc68;
        (*(pvVar5->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[3])
                  (pvVar5,local_220,pDVar6,3,local_250,&local_2b8);
        MFInfo::~MFInfo((MFInfo *)0x158012f);
        BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffc70);
        Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                      *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
        Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffc70,
                   (size_type)in_stack_fffffffffffffc68);
        FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffc70,
                   (value_type)in_stack_fffffffffffffc68);
      }
      Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                    *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
      in_stack_fffffffffffffc70 =
           (MLLinOp *)
           Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                     ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                      in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
      Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
      pBVar7 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                         ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                          in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
      Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
      in_stack_fffffffffffffc80 =
           Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
           operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                       *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
      local_2d8 = 0;
      uStack_2d0 = 0;
      local_2e8 = 0;
      uStack_2e0 = 0;
      local_2c8 = 0;
      MFInfo::MFInfo((MFInfo *)0x15802be);
      Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                    *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
      Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                    *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
      in_stack_fffffffffffffc68 =
           (BoxArray *)
           std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        *)in_stack_fffffffffffffc70);
      in_stack_fffffffffffffc88 = in_stack_fffffffffffffc68;
      (*(((FabArray<amrex::FArrayBox> *)&in_stack_fffffffffffffc70->_vptr_MLLinOp)->
        super_FabArrayBase)._vptr_FabArrayBase[2])
                (in_stack_fffffffffffffc70,pBVar7,in_stack_fffffffffffffc80,1,0,&local_2e8);
      MFInfo::~MFInfo((MFInfo *)0x158033b);
      iVar8 = iVar8 + 1;
    }
    iVar8 = iVar9 + 1;
  }
  return;
}

Assistant:

void
MLEBTensorOp::define (const Vector<Geometry>& a_geom,
                      const Vector<BoxArray>& a_grids,
                      const Vector<DistributionMapping>& a_dmap,
                      const LPInfo& a_info,
                      const Vector<EBFArrayBoxFactory const*>& a_factory)
{
    BL_PROFILE("MLEBTensorOp::define()");

    MLEBABecLap::define(a_geom, a_grids, a_dmap, a_info, a_factory);

    m_kappa.clear();
    m_kappa.resize(NAMRLevels());
    m_eb_kappa.resize(NAMRLevels());
    m_tauflux.resize(NAMRLevels());
    for (int amrlev = 0; amrlev < NAMRLevels(); ++amrlev) {
        m_kappa[amrlev].resize(std::min(kappa_num_mglevs,NMGLevels(amrlev)));
        m_eb_kappa[amrlev].resize(m_kappa[amrlev].size());
        m_tauflux[amrlev].resize(m_kappa[amrlev].size());
        for (int mglev = 0; mglev < m_kappa[amrlev].size(); ++mglev) {
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                m_kappa[amrlev][mglev][idim].define
                    (amrex::convert(m_grids[amrlev][mglev],
                                    IntVect::TheDimensionVector(idim)),
                     m_dmap[amrlev][mglev], 1, 0,
                     MFInfo(), *m_factory[amrlev][mglev]);
                m_tauflux[amrlev][mglev][idim].define
                    (amrex::convert(m_grids[amrlev][mglev],
                                    IntVect::TheDimensionVector(idim)),
                     m_dmap[amrlev][mglev],
                     AMREX_SPACEDIM, IntVect(1)-IntVect::TheDimensionVector(idim),
                     MFInfo(), *m_factory[amrlev][mglev]);
                m_tauflux[amrlev][mglev][idim].setVal(0.0);
            }
            m_eb_kappa[amrlev][mglev].define(m_grids[amrlev][mglev],
                                             m_dmap[amrlev][mglev],
                                             1, 0, MFInfo(),
                                             *m_factory[amrlev][mglev]);
        }
    }
}